

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void MemoryLeakWarningPlugin::restoreNewDeleteOverloads(void)

{
  int iVar1;
  
  iVar1 = save_counter;
  save_counter = save_counter + -1;
  if (iVar1 < 2) {
    operator_new_fptr = saved_operator_new_fptr;
    operator_new_nothrow_fptr = saved_operator_new_nothrow_fptr;
    operator_new_debug_fptr = saved_operator_new_debug_fptr;
    operator_new_array_fptr = saved_operator_new_array_fptr;
    operator_new_array_nothrow_fptr = saved_operator_new_array_nothrow_fptr;
    operator_new_array_debug_fptr = saved_operator_new_array_debug_fptr;
    operator_delete_fptr = saved_operator_delete_fptr;
    operator_delete_array_fptr = saved_operator_delete_array_fptr;
    malloc_fptr = saved_malloc_fptr;
    realloc_fptr = saved_realloc_fptr;
    free_fptr = saved_free_fptr;
  }
  return;
}

Assistant:

void MemoryLeakWarningPlugin::restoreNewDeleteOverloads()
{
#if CPPUTEST_USE_MEM_LEAK_DETECTION
    if (--save_counter > 0) return;
    operator_new_fptr = saved_operator_new_fptr;
    operator_new_nothrow_fptr = saved_operator_new_nothrow_fptr;
    operator_new_debug_fptr = saved_operator_new_debug_fptr;
    operator_new_array_fptr = saved_operator_new_array_fptr;
    operator_new_array_nothrow_fptr = saved_operator_new_array_nothrow_fptr;
    operator_new_array_debug_fptr = saved_operator_new_array_debug_fptr;
    operator_delete_fptr = saved_operator_delete_fptr;
    operator_delete_array_fptr = saved_operator_delete_array_fptr;
    malloc_fptr = saved_malloc_fptr;
    realloc_fptr = saved_realloc_fptr;
    free_fptr = saved_free_fptr;
#endif
}